

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_json_read_dbpointer(void)

{
  char *__needle;
  char cVar1;
  char *pcVar2;
  undefined **ppuVar3;
  bson_error_t error;
  bson_t b;
  undefined8 uVar4;
  uint local_380;
  uint local_37c;
  char local_378 [504];
  undefined1 local_180 [336];
  
  ppuVar3 = &PTR_anon_var_dwarf_1554b_0014f1f0;
  while( true ) {
    if (*ppuVar3 == (undefined *)0x0) {
      return;
    }
    cVar1 = bson_init_from_json(local_180,*ppuVar3,0xffffffffffffffff,&local_380);
    if (cVar1 != '\0') {
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
              ,0x455,"test_bson_json_read_dbpointer","!r");
      abort();
    }
    if (local_380 != 1) break;
    if (local_37c != 2) {
      uVar4 = 2;
      goto LAB_00122498;
    }
    __needle = ppuVar3[1];
    pcVar2 = strstr(local_378,__needle);
    if (pcVar2 == (char *)0x0) {
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",local_378,__needle)
      ;
      abort();
    }
    bson_destroy(local_180);
    ppuVar3 = ppuVar3 + 2;
  }
  uVar4 = 1;
  local_37c = local_380;
LAB_00122498:
  fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)local_37c,"==",uVar4,
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          0x457,"test_bson_json_read_dbpointer");
  abort();
}

Assistant:

static void
test_bson_json_read_dbpointer (void)
{
   bson_t b;
   bson_error_t error;
   bool r;

   /* must have both $ref and $id, $id must be ObjectId */
   const char *invalid[] = {
      "{\"p\": {\"$dbPointer\": {\"$ref\": \"db.collection\"}}",
      "$dbPointer requires both $id and $ref",

      "{\"p\": {\"$dbPointer\": {\"$ref\": \"db.collection\", \"$id\": 1}}",
      "$dbPointer.$id must be like {\"$oid\": ...\"}",

      "{\"p\": {\"$dbPointer\": {\"$id\": {"
      "\"$oid\": \"57e193d7a9cc81b4027498b1\"}}}}",
      "$dbPointer requires both $id and $ref",

      "{\"p\": {\"$dbPointer\": {}}}",
      "Empty $dbPointer",

      NULL};

   const char **p;

   for (p = invalid; *p; p += 2) {
      r = bson_init_from_json (&b, *p, -1, &error);
      BSON_ASSERT (!r);
      ASSERT_ERROR_CONTAINS (
         error, BSON_ERROR_JSON, BSON_JSON_ERROR_READ_INVALID_PARAM, *(p + 1));

      bson_destroy (&b);
   }
}